

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

Expression * __thiscall
wasm::OptimizeInstructions::deduplicateBinary(OptimizeInstructions *this,Binary *outer)

{
  BinaryOp BVar1;
  Type type;
  bool bVar2;
  BinaryOp BVar3;
  Expression *pEVar4;
  EffectAnalyzer local_1a0;
  
  type.id = (outer->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id;
  if ((type.id & 0xfffffffffffffffe) == 2) {
    pEVar4 = outer->right;
    if ((pEVar4->_id == BinaryId) && (outer->op == pEVar4[1]._id)) {
      EffectAnalyzer::EffectAnalyzer
                (&local_1a0,
                 &((this->
                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   ).super_Pass.runner)->options,
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).
                 super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .
                 super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .currModule,outer->left);
      bVar2 = EffectAnalyzer::hasSideEffects(&local_1a0);
      EffectAnalyzer::~EffectAnalyzer(&local_1a0);
      if (!bVar2) {
        bVar2 = ExpressionAnalyzer::equal((Expression *)pEVar4[1].type.id,outer->left);
        if (bVar2) {
          BVar1 = outer->op;
          BVar3 = Abstract::getBinary(type,Sub);
          if ((BVar1 == BVar3) ||
             (BVar1 = outer->op, BVar3 = Abstract::getBinary(type,Xor), BVar1 == BVar3))
          goto LAB_008f55a0;
          BVar1 = outer->op;
          BVar3 = Abstract::getBinary(type,And);
          if (BVar1 == BVar3) {
            return pEVar4;
          }
          BVar1 = outer->op;
          BVar3 = Abstract::getBinary(type,Or);
          if (BVar1 == BVar3) {
            return pEVar4;
          }
        }
        bVar2 = ExpressionAnalyzer::equal(*(Expression **)(pEVar4 + 2),outer->left);
        if ((bVar2) && (bVar2 = canReorder(this,outer->left,(Expression *)pEVar4[1].type.id), bVar2)
           ) {
          BVar1 = outer->op;
          BVar3 = Abstract::getBinary(type,Xor);
          if (BVar1 == BVar3) goto LAB_008f550e;
          BVar1 = outer->op;
          BVar3 = Abstract::getBinary(type,And);
          if (BVar1 == BVar3) {
            return pEVar4;
          }
          BVar1 = outer->op;
          BVar3 = Abstract::getBinary(type,Or);
          if (BVar1 == BVar3) {
            return pEVar4;
          }
        }
      }
    }
    pEVar4 = outer->left;
    if ((pEVar4->_id == BinaryId) && (outer->op == pEVar4[1]._id)) {
      EffectAnalyzer::EffectAnalyzer
                (&local_1a0,
                 &((this->
                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   ).super_Pass.runner)->options,
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).
                 super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .
                 super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .currModule,outer->right);
      bVar2 = EffectAnalyzer::hasSideEffects(&local_1a0);
      EffectAnalyzer::~EffectAnalyzer(&local_1a0);
      if (!bVar2) {
        bVar2 = ExpressionAnalyzer::equal(*(Expression **)(pEVar4 + 2),outer->right);
        if (bVar2) {
          BVar1 = outer->op;
          BVar3 = Abstract::getBinary(type,Xor);
          if (BVar1 == BVar3) {
LAB_008f550e:
            return (Expression *)pEVar4[1].type.id;
          }
          BVar1 = outer->op;
          BVar3 = Abstract::getBinary(type,RemS);
          if (BVar1 == BVar3) {
            return pEVar4;
          }
          BVar1 = outer->op;
          BVar3 = Abstract::getBinary(type,RemU);
          if (BVar1 == BVar3) {
            return pEVar4;
          }
          BVar1 = outer->op;
          BVar3 = Abstract::getBinary(type,And);
          if (BVar1 == BVar3) {
            return pEVar4;
          }
          BVar1 = outer->op;
          BVar3 = Abstract::getBinary(type,Or);
          if (BVar1 == BVar3) {
            return pEVar4;
          }
        }
        bVar2 = ExpressionAnalyzer::equal((Expression *)pEVar4[1].type.id,outer->right);
        if ((bVar2) &&
           (bVar2 = canReorder(this,(Expression *)pEVar4[1].type.id,*(Expression **)(pEVar4 + 2)),
           bVar2)) {
          BVar1 = outer->op;
          BVar3 = Abstract::getBinary(type,Xor);
          if (BVar1 != BVar3) {
            BVar1 = outer->op;
            BVar3 = Abstract::getBinary(type,And);
            if (BVar1 == BVar3) {
              return pEVar4;
            }
            BVar1 = outer->op;
            BVar3 = Abstract::getBinary(type,Or);
            if (BVar1 == BVar3) {
              return pEVar4;
            }
            return (Expression *)0x0;
          }
LAB_008f55a0:
          return *(Expression **)(pEVar4 + 2);
        }
      }
    }
  }
  return (Expression *)0x0;
}

Assistant:

Expression* deduplicateBinary(Binary* outer) {
    Type type = outer->type;
    if (type.isInteger()) {
      if (auto* inner = outer->right->dynCast<Binary>()) {
        if (outer->op == inner->op) {
          if (!EffectAnalyzer(getPassOptions(), *getModule(), outer->left)
                 .hasSideEffects()) {
            if (ExpressionAnalyzer::equal(inner->left, outer->left)) {
              // x - (x - y)  ==>   y
              // x ^ (x ^ y)  ==>   y
              if (outer->op == Abstract::getBinary(type, Abstract::Sub) ||
                  outer->op == Abstract::getBinary(type, Abstract::Xor)) {
                return inner->right;
              }
              // x & (x & y)  ==>   x & y
              // x | (x | y)  ==>   x | y
              if (outer->op == Abstract::getBinary(type, Abstract::And) ||
                  outer->op == Abstract::getBinary(type, Abstract::Or)) {
                return inner;
              }
            }
            if (ExpressionAnalyzer::equal(inner->right, outer->left) &&
                canReorder(outer->left, inner->left)) {
              // x ^ (y ^ x)  ==>   y
              // (note that we need the check for reordering here because if
              // e.g. y writes to a local that x reads, the second appearance
              // of x would be different from the first)
              if (outer->op == Abstract::getBinary(type, Abstract::Xor)) {
                return inner->left;
              }

              // x & (y & x)  ==>   y & x
              // x | (y | x)  ==>   y | x
              // (here we need the check for reordering for the more obvious
              // reason that previously x appeared before y, and now y appears
              // first; or, if we tried to emit x [&|] y here, reversing the
              // order, we'd be in the same situation as the previous comment)
              if (outer->op == Abstract::getBinary(type, Abstract::And) ||
                  outer->op == Abstract::getBinary(type, Abstract::Or)) {
                return inner;
              }
            }
          }
        }
      }
      if (auto* inner = outer->left->dynCast<Binary>()) {
        if (outer->op == inner->op) {
          if (!EffectAnalyzer(getPassOptions(), *getModule(), outer->right)
                 .hasSideEffects()) {
            if (ExpressionAnalyzer::equal(inner->right, outer->right)) {
              // (x ^ y) ^ y  ==>   x
              if (outer->op == Abstract::getBinary(type, Abstract::Xor)) {
                return inner->left;
              }
              // (x % y) % y  ==>   x % y
              // (x & y) & y  ==>   x & y
              // (x | y) | y  ==>   x | y
              if (outer->op == Abstract::getBinary(type, Abstract::RemS) ||
                  outer->op == Abstract::getBinary(type, Abstract::RemU) ||
                  outer->op == Abstract::getBinary(type, Abstract::And) ||
                  outer->op == Abstract::getBinary(type, Abstract::Or)) {
                return inner;
              }
            }
            // See comments in the parallel code earlier about ordering here.
            if (ExpressionAnalyzer::equal(inner->left, outer->right) &&
                canReorder(inner->left, inner->right)) {
              // (x ^ y) ^ x  ==>   y
              if (outer->op == Abstract::getBinary(type, Abstract::Xor)) {
                return inner->right;
              }
              // (x & y) & x  ==>   x & y
              // (x | y) | x  ==>   x | y
              if (outer->op == Abstract::getBinary(type, Abstract::And) ||
                  outer->op == Abstract::getBinary(type, Abstract::Or)) {
                return inner;
              }
            }
          }
        }
      }
    }
    return nullptr;
  }